

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  string *__lhs;
  bool bVar1;
  string filename;
  cmXMLWriter xml;
  string name;
  cmGeneratedFileStream fout;
  allocator<char> local_311;
  string local_310;
  string local_2f0;
  cmXMLWriter local_2d0;
  string local_278;
  cmGeneratedFileStream local_258;
  
  __lhs = &this->HomeDirectory;
  bVar1 = std::operator!=(__lhs,&this->HomeOutputDirectory);
  if (bVar1) {
    cmLocalGenerator::GetProjectName_abi_cxx11_
              ((string *)&local_258,
               *(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators
                ).super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                _M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"Source",(allocator<char> *)&local_310);
    GetPathBasename(&local_2f0,__lhs);
    GenerateProjectName(&local_278,(string *)&local_258,(string *)&local_2d0,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_258);
    std::operator+(&local_2f0,__lhs,"/.project");
    cmGeneratedFileStream::cmGeneratedFileStream(&local_258,&local_2f0,false,None);
    if (((&local_258.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [*(long *)((long)local_258.super_ofstream.
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
                   -0x18)] & 5) == 0) {
      cmXMLWriter::cmXMLWriter(&local_2d0,(ostream *)&local_258,0);
      cmXMLWriter::StartDocument(&local_2d0,"UTF-8");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"projectDescription",&local_311);
      cmXMLWriter::StartElement(&local_2d0,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"name",&local_311);
      cmXMLWriter::Element<std::__cxx11::string>(&local_2d0,&local_310,&local_278);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"comment",&local_311);
      cmXMLWriter::Element<char[1]>(&local_2d0,&local_310,(char (*) [1])0x49714e);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"projects",&local_311)
      ;
      cmXMLWriter::Element<char[1]>(&local_2d0,&local_310,(char (*) [1])0x49714e);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"buildSpec",&local_311);
      cmXMLWriter::Element<char[1]>(&local_2d0,&local_310,(char (*) [1])0x49714e);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"natures",&local_311);
      cmXMLWriter::Element<char[1]>(&local_2d0,&local_310,(char (*) [1])0x49714e);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"linkedResources",&local_311);
      cmXMLWriter::StartElement(&local_2d0,&local_310);
      std::__cxx11::string::~string((string *)&local_310);
      if (this->SupportsVirtualFolders == true) {
        CreateLinksToSubprojects(this,&local_2d0,__lhs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&this->SrcLinkedResources);
      }
      cmXMLWriter::EndElement(&local_2d0);
      cmXMLWriter::EndElement(&local_2d0);
      cmXMLWriter::EndDocument(&local_2d0);
      cmXMLWriter::~cmXMLWriter(&local_2d0);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_258);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_278);
    return;
  }
  __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmExtraEclipseCDT4Generator.cxx"
                ,0xab,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  std::string name = cmExtraEclipseCDT4Generator::GenerateProjectName(
    lg->GetProjectName(), "Source",
    cmExtraEclipseCDT4Generator::GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  cmXMLWriter xml(fout);
  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");
  xml.Element("name", name);
  xml.Element("comment", "");
  xml.Element("projects", "");
  xml.Element("buildSpec", "");
  xml.Element("natures", "");
  xml.StartElement("linkedResources");

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeDirectory);
    this->SrcLinkedResources.clear();
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
  xml.EndDocument();
}